

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::GetPrototypeAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar4;
  Var instance;
  RecyclableObject *pRVar5;
  undefined4 *puVar6;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar4 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)50>
                     (evt);
  instance = InflateVarInReplay(executeContext,pJVar4->VarArray[0]);
  if (instance != (Var)0x0) {
    BVar3 = Js::JavascriptOperators::IsObject(instance);
    if (BVar3 != 0) {
      pRVar5 = Js::VarTo<Js::RecyclableObject>(instance);
      if ((((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        instance = Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
      }
      pRVar5 = Js::JavascriptOperators::OP_GetPrototype(instance,scriptContext);
      if (pRVar5 != (RecyclableObject *)0x0) {
        BVar3 = Js::CrossSite::NeedMarshalVar(pRVar5,scriptContext);
        if (BVar3 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                             ,0x242,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                             "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)50>
                (executeContext,evt,pRVar5);
      return;
    }
  }
  return;
}

Assistant:

void GetPrototypeAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetPrototypeActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::Var res = Js::JavascriptOperators::OP_GetPrototype(var,ctx);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetPrototypeActionTag>(executeContext, evt, res);
        }